

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O3

void insert_node(qnode_ptr_t p,qnode_ptr_t *h,qnode_ptr_t *q)

{
  qnode_ptr_t ptVar1;
  qnode_ptr_t ptVar2;
  t_qnode **pptVar3;
  
  ptVar2 = *h;
  if (ptVar2 == (qnode_ptr_t)0x0) {
    ptVar1 = (qnode_ptr_t)0x0;
LAB_001024d9:
    *h = p;
    ptVar2 = (t_qnode *)0x0;
  }
  else {
    if (p->level < ptVar2->level) {
      do {
        ptVar1 = ptVar2;
        ptVar2 = ptVar1->forth;
        if (ptVar2 == (t_qnode *)0x0) {
          h = &ptVar1->forth;
          goto LAB_001024d9;
        }
      } while (p->level < ptVar2->level);
    }
    else {
      ptVar1 = (qnode_ptr_t)0x0;
    }
    pptVar3 = &ptVar1->forth;
    if (ptVar1 == (qnode_ptr_t)0x0) {
      pptVar3 = h;
    }
    *pptVar3 = p;
    q = &ptVar2->back;
  }
  *q = p;
  p->back = ptVar1;
  p->forth = ptVar2;
  return;
}

Assistant:

void insert_node(p,h,q)
qnode_ptr_t p, *h, *q ;

{ qnode_ptr_t s, t ;

  t = *h ;
  s = (qnode_ptr_t)NULL ;
  while ((t != (qnode_ptr_t)NULL) && (p->level < t->level)) {
    s = t ;
    t = t->forth ;
  }
  if (s != (qnode_ptr_t)NULL) {
    s->forth = p ;
  }
  else {
    *h = p ;
  }
  if (t != (qnode_ptr_t)NULL) {
    t->back = p ;
  }
  else {
    *q = p ;
  }
  p->back = s ;
  p->forth = t ;
}